

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::MergeFrom(Imputer *this,Imputer *from)

{
  ImputedValueCase IVar1;
  ReplaceValueCase RVar2;
  LogMessage *other;
  int64 iVar3;
  string *psVar4;
  DoubleVector *this_00;
  DoubleVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  StringToDoubleMap *this_02;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *this_03;
  Int64ToDoubleMap *from_03;
  InternalMetadataWithArenaLite *this_04;
  double dVar5;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  Imputer *local_58;
  Imputer *from_local;
  Imputer *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/Imputer.pb.cc"
               ,0x266);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_04 = &this->_internal_metadata_;
  this_local = (Imputer *)&local_58->_internal_metadata_;
  local_40 = this_04;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_04,&local_20->unknown_fields);
  }
  IVar1 = ImputedValue_case(local_58);
  switch(IVar1) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    dVar5 = imputeddoublevalue(local_58);
    set_imputeddoublevalue(this,dVar5);
    break;
  case kImputedInt64Value:
    iVar3 = imputedint64value(local_58);
    set_imputedint64value(this,iVar3);
    break;
  case kImputedStringValue:
    psVar4 = imputedstringvalue_abi_cxx11_(local_58);
    set_imputedstringvalue(this,psVar4);
    break;
  case kImputedDoubleArray:
    this_00 = mutable_imputeddoublearray(this);
    from_00 = imputeddoublearray(local_58);
    DoubleVector::MergeFrom(this_00,from_00);
    break;
  case kImputedInt64Array:
    this_01 = mutable_imputedint64array(this);
    from_01 = imputedint64array(local_58);
    Int64Vector::MergeFrom(this_01,from_01);
    break;
  case kImputedStringDictionary:
    this_02 = mutable_imputedstringdictionary(this);
    from_02 = imputedstringdictionary(local_58);
    StringToDoubleMap::MergeFrom(this_02,from_02);
    break;
  case kImputedInt64Dictionary:
    this_03 = mutable_imputedint64dictionary(this);
    from_03 = imputedint64dictionary(local_58);
    Int64ToDoubleMap::MergeFrom(this_03,from_03);
  }
  RVar2 = ReplaceValue_case(local_58);
  switch(RVar2) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    dVar5 = replacedoublevalue(local_58);
    set_replacedoublevalue(this,dVar5);
    break;
  case kReplaceInt64Value:
    iVar3 = replaceint64value(local_58);
    set_replaceint64value(this,iVar3);
    break;
  case kReplaceStringValue:
    psVar4 = replacestringvalue_abi_cxx11_(local_58);
    set_replacestringvalue(this,psVar4);
  }
  return;
}

Assistant:

void Imputer::MergeFrom(const Imputer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Imputer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
}